

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void __thiscall HFFilteredConsumer::~HFFilteredConsumer(HFFilteredConsumer *this)

{
  pointer piVar1;
  
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__HFFilteredConsumer_003ebb50;
  if (this->input != (byte *)0x0) {
    operator_delete__(this->input);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->args).dataRequested);
  piVar1 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->args).indices.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  HFSubConsumer::~HFSubConsumer(&this->super_HFSubConsumer);
  return;
}

Assistant:

HFFilteredConsumer::~HFFilteredConsumer(){
    delete [] input;
}